

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c++
# Opt level: O3

void kj::_::inlineRequireFailure
               (char *file,int line,char *expectation,char *macroArgs,char *message)

{
  Fault f;
  Fault f_1;
  Fault local_28;
  char *local_20;
  Fault local_18;
  undefined8 uStack_10;
  
  local_20 = message;
  if (message == (char *)0x0) {
    local_28.exception = (Exception *)0x0;
    local_18.exception = (Exception *)0x0;
    uStack_10 = 0;
    Debug::Fault::init(&local_28,(EVP_PKEY_CTX *)file);
    Debug::Fault::fatal(&local_28);
  }
  Debug::Fault::Fault<kj::Exception::Type,char_const*&>
            (&local_18,file,line,FAILED,expectation,macroArgs,&local_20);
  Debug::Fault::fatal(&local_18);
}

Assistant:

void inlineRequireFailure(const char* file, int line, const char* expectation,
                          const char* macroArgs, const char* message) {
  if (message == nullptr) {
    Debug::Fault f(file, line, kj::Exception::Type::FAILED, expectation, macroArgs);
    f.fatal();
  } else {
    Debug::Fault f(file, line, kj::Exception::Type::FAILED, expectation, macroArgs, message);
    f.fatal();
  }
}